

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event_loop.cpp
# Opt level: O2

bool __thiscall cppurses::detail::Timer_event_loop::loop_function(Timer_event_loop *this)

{
  long lVar1;
  _Base_ptr p_Var2;
  long lVar3;
  duration<long,_std::ratio<1L,_1000L>_> dVar4;
  rep rVar5;
  type time_to_sleep;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  
  for (p_Var2 = (this->registered_widgets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->registered_widgets_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    System::post_event<cppurses::Timer_event,cppurses::Widget&>(*(Widget **)(p_Var2 + 1));
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  lVar1 = (this->last_time_).__d.__r;
  dVar4 = std::function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()>::operator()
                    (&this->period_func_);
  local_20.__r = dVar4.__r * 1000000 + (lVar1 - lVar3);
  if (0 < local_20.__r) {
    std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>(&local_20);
  }
  rVar5 = std::chrono::_V2::system_clock::now();
  (this->last_time_).__d.__r = rVar5;
  return (this->registered_widgets_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0;
}

Assistant:

auto Timer_event_loop::loop_function() -> bool
{
    for (Widget* widg : registered_widgets_) {
        System::post_event<Timer_event>(*widg);
    }
    auto now           = std::chrono::high_resolution_clock::now();
    auto time_passed   = now - last_time_;
    auto time_to_sleep = period_func_() - time_passed;
    if (time_to_sleep > Period_t::zero()) {
        std::this_thread::sleep_for(time_to_sleep);
    }
    last_time_ = std::chrono::high_resolution_clock::now();
    return !registered_widgets_.empty();
}